

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

SQChar * IdType2Name(SQObjectType type)

{
  SQObjectType SVar1;
  
  SVar1 = type & 0xffffff;
  if (SVar1 < 0x200) {
    if (SVar1 < 0x20) {
      switch(SVar1) {
      case 1:
        return "null";
      case 2:
        return "integer";
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        return "float";
      case 8:
        return "bool";
      default:
        if (SVar1 == 0x10) {
          return "string";
        }
      }
    }
    else if (SVar1 < 0x80) {
      if (SVar1 == 0x20) {
        return "table";
      }
      if (SVar1 == 0x40) {
        return "array";
      }
    }
    else {
      if (SVar1 == 0x80) {
LAB_00121dac:
        return "userdata";
      }
      if (SVar1 == 0x100) goto LAB_00121da4;
    }
  }
  else if (SVar1 < 0x2000) {
    if (SVar1 < OT_USERPOINTER) {
      if (SVar1 == 0x200) goto LAB_00121da4;
      if (SVar1 == 0x400) {
        return "generator";
      }
    }
    else {
      if (SVar1 == OT_USERPOINTER) goto LAB_00121dac;
      if (SVar1 == 0x1000) {
        return "thread";
      }
    }
  }
  else if (SVar1 < 0x8000) {
    if (SVar1 == 0x2000) {
LAB_00121da4:
      return "function";
    }
    if (SVar1 == 0x4000) {
      return "class";
    }
  }
  else {
    if (SVar1 == 0x8000) {
      return "instance";
    }
    if (SVar1 == 0x10000) {
      return "weakref";
    }
    if (SVar1 == 0x20000) {
      return "outer";
    }
  }
  return (SQChar *)0x0;
}

Assistant:

const SQChar *IdType2Name(SQObjectType type)
{
    switch(_RAW_TYPE(type))
    {
    case _RT_NULL:return _SC("null");
    case _RT_INTEGER:return _SC("integer");
    case _RT_FLOAT:return _SC("float");
    case _RT_BOOL:return _SC("bool");
    case _RT_STRING:return _SC("string");
    case _RT_TABLE:return _SC("table");
    case _RT_ARRAY:return _SC("array");
    case _RT_GENERATOR:return _SC("generator");
    case _RT_CLOSURE:
    case _RT_NATIVECLOSURE:
        return _SC("function");
    case _RT_USERDATA:
    case _RT_USERPOINTER:
        return _SC("userdata");
    case _RT_THREAD: return _SC("thread");
    case _RT_FUNCPROTO: return _SC("function");
    case _RT_CLASS: return _SC("class");
    case _RT_INSTANCE: return _SC("instance");
    case _RT_WEAKREF: return _SC("weakref");
    case _RT_OUTER: return _SC("outer");
    default:
        return NULL;
    }
}